

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

void INT_EVsubmit_encoded
               (CManager_conflict cm,EVstone stone,void *data,size_t data_len,attr_list attrs)

{
  event_path_data evp;
  int iVar1;
  event_item *event;
  stone_type p_Var2;
  undefined8 uVar3;
  FMFormat p_Var4;
  attr_list p_Var5;
  CManager_conflict evp_00;
  
  evp = cm->evp;
  event = (event_item *)INT_CMmalloc(0x68);
  event->ref_count = 0;
  event->event_encoded = 0;
  *(undefined8 *)&event->contents = 0;
  event->encoded_event = (void *)0x0;
  event->event_len = 0;
  event->decoded_event = (void *)0x0;
  event->encoded_eventv = (FFSEncodeVector)0x0;
  event->reference_format = (FMFormat)0x0;
  event->ioBuffer = (FFSBuffer)0x0;
  event->format = (CMFormat)0x0;
  event->attrs = (attr_list)0x0;
  event->cm = (CManager_conflict)0x0;
  event->free_arg = (void *)0x0;
  event->free_func = (EVFreeFunction)0x0;
  event->ref_count = 1;
  event->event_len = -1;
  p_Var2 = stone_struct(evp,stone);
  if (p_Var2 != (stone_type)0x0) {
    event->event_encoded = 1;
    event->contents = Event_App_Owned;
    event->encoded_event = data;
    event->cm = cm;
    event->event_len = data_len;
    uVar3 = FFSTypeHandle_from_encode(evp->ffsc,data);
    p_Var4 = (FMFormat)FMFormat_of_original(uVar3);
    event->reference_format = p_Var4;
    p_Var5 = CMint_add_ref_attr_list
                       (cm,attrs,
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                        ,0xd87);
    event->attrs = p_Var5;
    internal_path_submit(cm,stone,event);
    do {
      evp_00 = cm;
      iVar1 = process_local_actions(cm);
    } while (iVar1 != 0);
    return_event((event_path_data)evp_00,event);
    return;
  }
  return;
}

Assistant:

void
INT_EVsubmit_encoded(CManager cm, EVstone stone, void *data, size_t data_len, attr_list attrs)
{
    event_path_data evp = cm->evp;
    event_item *event = get_free_event(evp);
    if (stone_struct(evp, stone) == NULL) return;

    event->contents = Event_App_Owned;
    event->event_encoded = 1;
    event->encoded_event = data;
    event->cm = cm;
    event->event_len = data_len;
    event->reference_format = FMFormat_of_original(FFSTypeHandle_from_encode(evp->ffsc, 
							data));

    event->attrs = CMadd_ref_attr_list(cm, attrs);
    internal_path_submit(cm, stone, event);
    while (process_local_actions(cm));
    return_event(cm->evp, event);
}